

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fkLookupParent(Parse *pParse,int iDb,Table *pTab,Index *pIdx,FKey *pFKey,int *aiCol,int regData
                   ,int nIncr,int isIgnore)

{
  byte bVar1;
  uint p2;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vdbe *p;
  Parse *pPVar6;
  char *zP4;
  int *piVar7;
  Op *pOVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int local_54;
  
  p = sqlite3GetVdbe(pParse);
  iVar9 = pParse->nTab;
  p2 = sqlite3VdbeMakeLabel((Vdbe *)p->pParse);
  if (nIncr < 0) {
    sqlite3VdbeAddOp3(p,0x2e,(uint)pFKey->isDeferred,p2,0);
  }
  uVar11 = (ulong)(uint)pFKey->nCol;
  if (0 < pFKey->nCol) {
    lVar12 = 0;
    do {
      sqlite3VdbeAddOp3(p,0x32,aiCol[lVar12] + regData + 1,p2,0);
      lVar12 = lVar12 + 1;
      uVar11 = (ulong)pFKey->nCol;
    } while (lVar12 < (long)uVar11);
  }
  iVar9 = iVar9 + -1;
  if (isIgnore == 0) {
    if (pIdx == (Index *)0x0) {
      if (pParse->nTempReg == '\0') {
        iVar2 = pParse->nMem + 1;
        pParse->nMem = iVar2;
      }
      else {
        bVar1 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar1;
        iVar2 = pParse->aTempReg[bVar1];
      }
      sqlite3VdbeAddOp3(p,0x4f,regData + *aiCol + 1,iVar2,0);
      iVar5 = sqlite3VdbeAddOp3(p,0xf,iVar2,0,0);
      if ((nIncr == 1) && (pFKey->pFrom == pTab)) {
        sqlite3VdbeAddOp3(p,0x35,regData,p2,iVar2);
        if (0 < (long)p->nOp) {
          p->aOp[(long)p->nOp + -1].p5 = 0x90;
        }
      }
      sqlite3OpenTable(pParse,iVar9,iDb,pTab,0x6d);
      sqlite3VdbeAddOp3(p,0x1f,iVar9,0,iVar2);
      sqlite3VdbeAddOp3(p,0xb,0,p2,0);
      iVar4 = p->nOp;
      if (p->db->mallocFailed == '\0') {
        iVar3 = iVar4 + -1;
        if (-1 < iVar5) {
          iVar3 = iVar5;
        }
        pOVar8 = p->aOp;
        pOVar8[(int)((iVar4 < 2 | 0xfffffffe) + iVar4)].p2 = iVar4;
        pOVar8 = pOVar8 + iVar3;
      }
      else {
        pOVar8 = (Op *)&sqlite3VdbeGetOp_dummy;
        DAT_001a5720 = iVar4;
      }
      pOVar8->p2 = iVar4;
      if (iVar2 != 0) {
        bVar1 = pParse->nTempReg;
        if ((ulong)bVar1 < 8) {
          pParse->nTempReg = bVar1 + 1;
          pParse->aTempReg[bVar1] = iVar2;
        }
      }
    }
    else {
      iVar5 = (int)uVar11;
      iVar2 = sqlite3GetTempRange(pParse,iVar5);
      if (pParse->nTempReg == '\0') {
        local_54 = pParse->nMem + 1;
        pParse->nMem = local_54;
      }
      else {
        bVar1 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar1;
        local_54 = pParse->aTempReg[bVar1];
      }
      sqlite3VdbeAddOp3(p,0x6d,iVar9,pIdx->tnum,iDb);
      sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
      if (0 < iVar5) {
        uVar10 = 0;
        do {
          sqlite3VdbeAddOp3(p,0x4e,aiCol[uVar10] + regData + 1,(int)uVar10 + iVar2,0);
          uVar10 = uVar10 + 1;
        } while ((uVar11 & 0xffffffff) != uVar10);
      }
      if ((nIncr == 1) && (pFKey->pFrom == pTab)) {
        if (0 < iVar5) {
          iVar4 = p->nOp;
          uVar10 = 0;
          do {
            iVar3 = 0;
            if (pIdx->aiColumn[uVar10] != pTab->iPKey) {
              iVar3 = pIdx->aiColumn[uVar10] + 1;
            }
            sqlite3VdbeAddOp3(p,0x34,aiCol[uVar10] + regData + 1,iVar4 + iVar5 + 1,iVar3 + regData);
            if (0 < (long)p->nOp) {
              p->aOp[(long)p->nOp + -1].p5 = 0x10;
            }
            uVar10 = uVar10 + 1;
          } while ((uVar11 & 0xffffffff) != uVar10);
        }
        sqlite3VdbeAddOp3(p,0xb,0,p2,0);
      }
      zP4 = sqlite3IndexAffinityStr(pParse->db,pIdx);
      iVar4 = sqlite3VdbeAddOp3(p,0x66,iVar2,iVar5,local_54);
      sqlite3VdbeChangeP4(p,iVar4,zP4,iVar5);
      iVar4 = sqlite3VdbeAddOp3(p,0x1d,iVar9,p2,local_54);
      if (p->db->mallocFailed == '\0') {
        pOVar8 = p->aOp;
        pOVar8[iVar4].p4type = -3;
        pOVar8[iVar4].p4.i = 0;
      }
      if (local_54 != 0) {
        bVar1 = pParse->nTempReg;
        if ((ulong)bVar1 < 8) {
          pParse->nTempReg = bVar1 + 1;
          pParse->aTempReg[bVar1] = local_54;
        }
      }
      if (iVar5 == 1) {
        if (iVar2 != 0) {
          bVar1 = pParse->nTempReg;
          if ((ulong)bVar1 < 8) {
            pParse->nTempReg = bVar1 + 1;
            piVar7 = pParse->aTempReg + bVar1;
            goto LAB_001751d1;
          }
        }
      }
      else if (pParse->nRangeReg < iVar5) {
        pParse->nRangeReg = iVar5;
        piVar7 = &pParse->iRangeReg;
LAB_001751d1:
        *piVar7 = iVar2;
      }
    }
  }
  bVar1 = pFKey->isDeferred;
  if (bVar1 == 0) {
    if ((((pParse->db->flags & 0x80000) == 0) && (pParse->pToplevel == (Parse *)0x0)) &&
       (pParse->isMultiWrite == '\0')) {
      sqlite3HaltConstraint(pParse,0x313,2,(char *)0x0,-1,'\x04');
      goto LAB_00174edf;
    }
    if (0 < nIncr) {
      pPVar6 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar6 = pParse;
      }
      pPVar6->mayAbort = '\x01';
    }
  }
  sqlite3VdbeAddOp3(p,0x97,(uint)bVar1,nIncr,0);
LAB_00174edf:
  piVar7 = p->pParse->aLabel;
  if (piVar7 != (int *)0x0) {
    piVar7[(int)~p2] = p->nOp;
  }
  sqlite3VdbeAddOp3(p,0x75,iVar9,0,0);
  return;
}

Assistant:

static void fkLookupParent(
  Parse *pParse,        /* Parse context */
  int iDb,              /* Index of database housing pTab */
  Table *pTab,          /* Parent table of FK pFKey */
  Index *pIdx,          /* Unique index on parent key columns in pTab */
  FKey *pFKey,          /* Foreign key constraint */
  int *aiCol,           /* Map from parent key columns to child table columns */
  int regData,          /* Address of array containing child table row */
  int nIncr,            /* Increment constraint counter by this */
  int isIgnore          /* If true, pretend pTab contains all NULL values */
){
  int i;                                    /* Iterator variable */
  Vdbe *v = sqlite3GetVdbe(pParse);         /* Vdbe to add code to */
  int iCur = pParse->nTab - 1;              /* Cursor number to use */
  int iOk = sqlite3VdbeMakeLabel(v);        /* jump here if parent key found */

  sqlite3VdbeVerifyAbortable(v,
    (!pFKey->isDeferred
      && !(pParse->db->flags & SQLITE_DeferFKs)
      && !pParse->pToplevel 
      && !pParse->isMultiWrite) ? OE_Abort : OE_Ignore);

  /* If nIncr is less than zero, then check at runtime if there are any
  ** outstanding constraints to resolve. If there are not, there is no need
  ** to check if deleting this row resolves any outstanding violations.
  **
  ** Check if any of the key columns in the child table row are NULL. If 
  ** any are, then the constraint is considered satisfied. No need to 
  ** search for a matching row in the parent table.  */
  if( nIncr<0 ){
    sqlite3VdbeAddOp2(v, OP_FkIfZero, pFKey->isDeferred, iOk);
    VdbeCoverage(v);
  }
  for(i=0; i<pFKey->nCol; i++){
    int iReg = aiCol[i] + regData + 1;
    sqlite3VdbeAddOp2(v, OP_IsNull, iReg, iOk); VdbeCoverage(v);
  }

  if( isIgnore==0 ){
    if( pIdx==0 ){
      /* If pIdx is NULL, then the parent key is the INTEGER PRIMARY KEY
      ** column of the parent table (table pTab).  */
      int iMustBeInt;               /* Address of MustBeInt instruction */
      int regTemp = sqlite3GetTempReg(pParse);
  
      /* Invoke MustBeInt to coerce the child key value to an integer (i.e. 
      ** apply the affinity of the parent key). If this fails, then there
      ** is no matching parent key. Before using MustBeInt, make a copy of
      ** the value. Otherwise, the value inserted into the child key column
      ** will have INTEGER affinity applied to it, which may not be correct.  */
      sqlite3VdbeAddOp2(v, OP_SCopy, aiCol[0]+1+regData, regTemp);
      iMustBeInt = sqlite3VdbeAddOp2(v, OP_MustBeInt, regTemp, 0);
      VdbeCoverage(v);
  
      /* If the parent table is the same as the child table, and we are about
      ** to increment the constraint-counter (i.e. this is an INSERT operation),
      ** then check if the row being inserted matches itself. If so, do not
      ** increment the constraint-counter.  */
      if( pTab==pFKey->pFrom && nIncr==1 ){
        sqlite3VdbeAddOp3(v, OP_Eq, regData, iOk, regTemp); VdbeCoverage(v);
        sqlite3VdbeChangeP5(v, SQLITE_NOTNULL);
      }
  
      sqlite3OpenTable(pParse, iCur, iDb, pTab, OP_OpenRead);
      sqlite3VdbeAddOp3(v, OP_NotExists, iCur, 0, regTemp); VdbeCoverage(v);
      sqlite3VdbeGoto(v, iOk);
      sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
      sqlite3VdbeJumpHere(v, iMustBeInt);
      sqlite3ReleaseTempReg(pParse, regTemp);
    }else{
      int nCol = pFKey->nCol;
      int regTemp = sqlite3GetTempRange(pParse, nCol);
      int regRec = sqlite3GetTempReg(pParse);
  
      sqlite3VdbeAddOp3(v, OP_OpenRead, iCur, pIdx->tnum, iDb);
      sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
      for(i=0; i<nCol; i++){
        sqlite3VdbeAddOp2(v, OP_Copy, aiCol[i]+1+regData, regTemp+i);
      }
  
      /* If the parent table is the same as the child table, and we are about
      ** to increment the constraint-counter (i.e. this is an INSERT operation),
      ** then check if the row being inserted matches itself. If so, do not
      ** increment the constraint-counter. 
      **
      ** If any of the parent-key values are NULL, then the row cannot match 
      ** itself. So set JUMPIFNULL to make sure we do the OP_Found if any
      ** of the parent-key values are NULL (at this point it is known that
      ** none of the child key values are).
      */
      if( pTab==pFKey->pFrom && nIncr==1 ){
        int iJump = sqlite3VdbeCurrentAddr(v) + nCol + 1;
        for(i=0; i<nCol; i++){
          int iChild = aiCol[i]+1+regData;
          int iParent = pIdx->aiColumn[i]+1+regData;
          assert( pIdx->aiColumn[i]>=0 );
          assert( aiCol[i]!=pTab->iPKey );
          if( pIdx->aiColumn[i]==pTab->iPKey ){
            /* The parent key is a composite key that includes the IPK column */
            iParent = regData;
          }
          sqlite3VdbeAddOp3(v, OP_Ne, iChild, iJump, iParent); VdbeCoverage(v);
          sqlite3VdbeChangeP5(v, SQLITE_JUMPIFNULL);
        }
        sqlite3VdbeGoto(v, iOk);
      }
  
      sqlite3VdbeAddOp4(v, OP_MakeRecord, regTemp, nCol, regRec,
                        sqlite3IndexAffinityStr(pParse->db,pIdx), nCol);
      sqlite3VdbeAddOp4Int(v, OP_Found, iCur, iOk, regRec, 0); VdbeCoverage(v);
  
      sqlite3ReleaseTempReg(pParse, regRec);
      sqlite3ReleaseTempRange(pParse, regTemp, nCol);
    }
  }

  if( !pFKey->isDeferred && !(pParse->db->flags & SQLITE_DeferFKs)
   && !pParse->pToplevel 
   && !pParse->isMultiWrite 
  ){
    /* Special case: If this is an INSERT statement that will insert exactly
    ** one row into the table, raise a constraint immediately instead of
    ** incrementing a counter. This is necessary as the VM code is being
    ** generated for will not open a statement transaction.  */
    assert( nIncr==1 );
    sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_FOREIGNKEY,
        OE_Abort, 0, P4_STATIC, P5_ConstraintFK);
  }else{
    if( nIncr>0 && pFKey->isDeferred==0 ){
      sqlite3MayAbort(pParse);
    }
    sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, nIncr);
  }

  sqlite3VdbeResolveLabel(v, iOk);
  sqlite3VdbeAddOp1(v, OP_Close, iCur);
}